

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utf8.c
# Opt level: O0

size_t encode_utf8(void *output,unsigned_long ch)

{
  byte bVar1;
  long local_28;
  uchar *p;
  uchar *start;
  unsigned_long ch_local;
  void *output_local;
  
  bVar1 = (byte)ch;
  if (ch < 0x80) {
    local_28 = (long)output + 1;
    *(byte *)output = bVar1;
  }
  else if (ch < 0x800) {
    *(byte *)output = (byte)(ch >> 6) | 0xc0;
    local_28 = (long)output + 2;
    *(byte *)((long)output + 1) = bVar1 & 0x3f | 0x80;
  }
  else if (ch < 0x10000) {
    *(byte *)output = (byte)(ch >> 0xc) | 0xe0;
    *(byte *)((long)output + 1) = (byte)(ch >> 6) & 0x3f | 0x80;
    local_28 = (long)output + 3;
    *(byte *)((long)output + 2) = bVar1 & 0x3f | 0x80;
  }
  else {
    if (0x10ffff < ch) {
      __assert_fail("ch <= 0x10FFFF",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/encode_utf8.c"
                    ,0x16,"size_t encode_utf8(void *, unsigned long)");
    }
    *(byte *)output = (byte)(ch >> 0x12) | 0xf0;
    *(byte *)((long)output + 1) = (byte)(ch >> 0xc) & 0x3f | 0x80;
    *(byte *)((long)output + 2) = (byte)(ch >> 6) & 0x3f | 0x80;
    local_28 = (long)output + 4;
    *(byte *)((long)output + 3) = bVar1 & 0x3f | 0x80;
  }
  return local_28 - (long)output;
}

Assistant:

size_t encode_utf8(void *output, unsigned long ch)
{
    unsigned char *start = (unsigned char *)output, *p = start;

    if (ch < 0x80) {
        *p++ = ch;
    } else if (ch < 0x800) {
        *p++ = 0xC0 | (ch >> 6);
        *p++ = 0x80 | (ch & 0x3F);
    } else if (ch < 0x10000) {
        *p++ = 0xE0 | (ch >> 12);
        *p++ = 0x80 | ((ch >> 6) & 0x3F);
        *p++ = 0x80 | (ch & 0x3F);
    } else {
        assert(ch <= 0x10FFFF);
        *p++ = 0xF0 | (ch >> 18);
        *p++ = 0x80 | ((ch >> 12) & 0x3F);
        *p++ = 0x80 | ((ch >> 6) & 0x3F);
        *p++ = 0x80 | (ch & 0x3F);
    }
    return p - start;
}